

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmTarget * __thiscall
cmLocalGenerator::LinearGetTargetWithOutput(cmLocalGenerator *this,string *name)

{
  cmTarget *this_00;
  bool bVar1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *this_01;
  reference ppcVar2;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar3;
  cmTarget *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range1;
  string *name_local;
  cmLocalGenerator *this_local;
  
  this_01 = cmMakefile::GetOrderedTargets(this->Makefile);
  __end1 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin(this_01);
  t = (cmTarget *)std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                *)&t);
    if (!bVar1) {
      return (cmTarget *)0x0;
    }
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar2;
    pvVar3 = cmTarget::GetPreBuildCommands(this_00);
    bVar1 = anon_unknown.dwarf_5fc59b::AnyTargetCommandOutputMatches(name,pvVar3);
    if (bVar1) {
      return this_00;
    }
    pvVar3 = cmTarget::GetPreLinkCommands(this_00);
    bVar1 = anon_unknown.dwarf_5fc59b::AnyTargetCommandOutputMatches(name,pvVar3);
    if (bVar1) {
      return this_00;
    }
    pvVar3 = cmTarget::GetPostBuildCommands(this_00);
    bVar1 = anon_unknown.dwarf_5fc59b::AnyTargetCommandOutputMatches(name,pvVar3);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
    operator++(&__end1);
  }
  return this_00;
}

Assistant:

cmTarget* cmLocalGenerator::LinearGetTargetWithOutput(
  const std::string& name) const
{
  // We go through the ordered vector of targets to get reproducible results
  // should multiple names match.
  for (cmTarget* t : this->Makefile->GetOrderedTargets()) {
    // Does the output of any command match the source file name?
    if (AnyTargetCommandOutputMatches(name, t->GetPreBuildCommands())) {
      return t;
    }
    if (AnyTargetCommandOutputMatches(name, t->GetPreLinkCommands())) {
      return t;
    }
    if (AnyTargetCommandOutputMatches(name, t->GetPostBuildCommands())) {
      return t;
    }
  }
  return nullptr;
}